

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall sqlite::Connection::Connection(Connection *this,string *filename)

{
  int sqlite_error_code;
  Runtime_error *this_00;
  char *__rhs;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->db_ = (sqlite3 *)0x0;
  sqlite_error_code = sqlite3_open((filename->_M_dataplus)._M_p,this);
  if (sqlite_error_code == 0) {
    sqlite3_extended_result_codes(this->db_,1);
    return;
  }
  sqlite3_close(this->db_);
  this_00 = (Runtime_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_80,"Error connecting to db (",filename);
  std::operator+(&local_60,&local_80,"): ");
  __rhs = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_40,&local_60,__rhs);
  std::__cxx11::string::string((string *)&local_a0,"",&local_a1);
  Runtime_error::Runtime_error(this_00,&local_40,&local_a0,sqlite_error_code,(sqlite3 *)0x0);
  __cxa_throw(this_00,&Runtime_error::typeinfo,Runtime_error::~Runtime_error);
}

Assistant:

Connection::Connection(const std::string & filename)
    {
        int status = sqlite3_open(filename.c_str(), &db_);
        if(status != SQLITE_OK)
        {
            sqlite3_close(db_);
            throw Runtime_error("Error connecting to db (" +
                filename + "): " + sqlite3_errmsg(db_), "", status, nullptr);
        }
        sqlite3_extended_result_codes(db_, true);
    }